

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeComputeTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::exceed_shader_storage_block_limit
               (NegativeTestContext *ctx)

{
  int iVar1;
  ostream *poVar2;
  RenderContext *renderCtx;
  ProgramSources *sources;
  allocator<char> local_559;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  ShaderSource local_4d8;
  ProgramSources local_4b0;
  undefined1 local_3e0 [8];
  ShaderProgram program;
  ostringstream local_300 [8];
  ostringstream shaderBody;
  ostringstream local_188 [8];
  ostringstream shaderDecl;
  NegativeTestContext *ctx_local;
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::__cxx11::ostringstream::ostringstream(local_300);
  poVar2 = std::operator<<((ostream *)local_188,"layout(std140, binding = 0) buffer Block\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  poVar2 = std::operator<<(poVar2,"    highp vec4 val;\n");
  poVar2 = std::operator<<(poVar2,"} block[");
  iVar1 = getResourceLimit(ctx,0x90db);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1 + 1);
  std::operator<<(poVar2,"];\n");
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  glu::ProgramSources::ProgramSources(&local_4b0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  generateComputeShader(&local_4f8,ctx,&local_518,&local_538);
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_4d8,&local_4f8);
  sources = glu::ProgramSources::operator<<(&local_4b0,&local_4d8);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_3e0,renderCtx,sources);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  glu::ProgramSources::~ProgramSources(&local_4b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,
             "Link error is generated if compute shader exceeds GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS."
             ,&local_559);
  NegativeTestContext::beginSection(ctx,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  verifyLinkError(ctx,(ShaderProgram *)local_3e0);
  NegativeTestContext::endSection(ctx);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_3e0);
  std::__cxx11::ostringstream::~ostringstream(local_300);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void exceed_shader_storage_block_limit (NegativeTestContext& ctx)
{
	std::ostringstream shaderDecl;
	std::ostringstream shaderBody;

	shaderDecl	<< "layout(std140, binding = 0) buffer Block\n"
				<< "{\n"
				<< "    highp vec4 val;\n"
				<< "} block[" << getResourceLimit(ctx, GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS) + 1 << "];\n";

	glu::ShaderProgram	program(ctx.getRenderContext(), glu::ProgramSources()
			<< glu::ComputeSource(generateComputeShader(ctx, shaderDecl.str(), shaderBody.str())));

	ctx.beginSection("Link error is generated if compute shader exceeds GL_MAX_COMPUTE_SHADER_STORAGE_BLOCKS.");
	verifyLinkError(ctx, program);
	ctx.endSection();
}